

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O2

bool __thiscall QPicture::save(QPicture *this,QIODevice *dev)

{
  ushort uVar1;
  long lVar2;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->super_QPaintDevice).painters;
  if (uVar1 == 0) {
    lVar2 = QBuffer::buffer();
    puVar3 = *(undefined8 **)(lVar2 + 8);
    if (puVar3 == (undefined8 *)0x0) {
      puVar3 = &QByteArray::_empty;
    }
    QBuffer::buffer();
    QIODevice::write((char *)dev,(longlong)puVar3);
  }
  else {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = "default";
    QMessageLogger::warning
              (local_48,"QPicture::save: still being painted on. Call QPainter::end() first");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QPicture::save(QIODevice *dev)
{
    if (paintingActive()) {
        qWarning("QPicture::save: still being painted on. "
                  "Call QPainter::end() first");
        return false;
    }

    dev->write(d_func()->pictb.buffer(), d_func()->pictb.buffer().size());
    return true;
}